

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

Precision __thiscall
spirv_cross::CompilerGLSL::analyze_expression_precision
          (CompilerGLSL *this,uint32_t *args,uint32_t length)

{
  Types TVar1;
  bool bVar2;
  Precision PVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  
  if (length != 0) {
    uVar6 = 0;
    bVar5 = false;
    bVar4 = 0;
    do {
      TVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[args[uVar6]].
              type;
      if ((TypeUndef < TVar1) || ((0x1208U >> (TVar1 & 0x1f) & 1) == 0)) {
        bVar2 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)args[uVar6],DecorationRelaxedPrecision);
        bVar4 = bVar4 | bVar2;
        bVar5 = (bool)(bVar5 | !bVar2);
      }
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
    PVar3 = Highp;
    if (!bVar5) {
      PVar3 = (uint)bVar4 * 2;
    }
    return PVar3;
  }
  return DontCare;
}

Assistant:

CompilerGLSL::Options::Precision CompilerGLSL::analyze_expression_precision(const uint32_t *args, uint32_t length) const
{
	// Now, analyze the precision at which the arguments would run.
	// GLSL rules are such that the precision used to evaluate an expression is equal to the highest precision
	// for the inputs. Constants do not have inherent precision and do not contribute to this decision.
	// If all inputs are constants, they inherit precision from outer expressions, including an l-value.
	// In this case, we'll have to force a temporary for dst_id so that we can bind the constant expression with
	// correct precision.
	bool expression_has_highp = false;
	bool expression_has_mediump = false;

	for (uint32_t i = 0; i < length; i++)
	{
		uint32_t arg = args[i];

		auto handle_type = ir.ids[arg].get_type();
		if (handle_type == TypeConstant || handle_type == TypeConstantOp || handle_type == TypeUndef)
			continue;

		if (has_decoration(arg, DecorationRelaxedPrecision))
			expression_has_mediump = true;
		else
			expression_has_highp = true;
	}

	if (expression_has_highp)
		return Options::Highp;
	else if (expression_has_mediump)
		return Options::Mediump;
	else
		return Options::DontCare;
}